

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O3

Token __thiscall slang::parsing::Preprocessor::MacroParser::expect(MacroParser *this,TokenKind kind)

{
  pointer pTVar1;
  undefined2 uVar2;
  undefined1 uVar4;
  undefined1 uVar5;
  BumpAllocator *alloc;
  Diagnostics *diagnostics;
  undefined4 uVar6;
  Info *pIVar3;
  Token matchingDelim;
  ulong uVar7;
  pointer pTVar8;
  Token TVar9;
  Token actual;
  Token last;
  Token local_68;
  Token local_58;
  Token local_40;
  
  uVar7 = (ulong)this->currentIndex;
  if ((this->buffer)._M_extent._M_extent_value <= uVar7) {
    TVar9 = Preprocessor::expect(this->pp,kind);
    return TVar9;
  }
  pTVar8 = (this->buffer)._M_ptr;
  if (pTVar8[uVar7].kind == kind) {
    TVar9 = next(this);
    return TVar9;
  }
  if (uVar7 == 0) {
    Token::Token(&local_68);
    uVar7 = (ulong)this->currentIndex;
    pTVar8 = (this->buffer)._M_ptr;
  }
  else {
    pTVar1 = pTVar8 + (this->currentIndex - 1);
    local_68.kind = pTVar1->kind;
    local_68._2_1_ = pTVar1->field_0x2;
    local_68.numFlags.raw = (pTVar1->numFlags).raw;
    local_68.rawLen = pTVar1->rawLen;
    local_68.info = pTVar1->info;
  }
  alloc = this->pp->alloc;
  diagnostics = this->pp->diagnostics;
  pTVar1 = pTVar8 + uVar7;
  uVar2 = pTVar1->kind;
  uVar4 = pTVar1->field_0x2;
  uVar5 = pTVar1->numFlags;
  uVar6 = pTVar1->rawLen;
  actual.rawLen = uVar6;
  actual.numFlags.raw = uVar5;
  actual._2_1_ = uVar4;
  actual.kind = uVar2;
  pIVar3 = pTVar8[uVar7].info;
  local_58.kind = local_68.kind;
  local_58._2_1_ = local_68._2_1_;
  local_58.numFlags.raw = local_68.numFlags.raw;
  local_58.rawLen = local_68.rawLen;
  local_58.info = local_68.info;
  Token::Token(&local_40);
  TVar9.info = local_58.info;
  TVar9.kind = local_58.kind;
  TVar9._2_1_ = local_58._2_1_;
  TVar9.numFlags.raw = local_58.numFlags.raw;
  TVar9.rawLen = local_58.rawLen;
  matchingDelim.info = local_40.info;
  matchingDelim.kind = local_40.kind;
  matchingDelim._2_1_ = local_40._2_1_;
  matchingDelim.numFlags.raw = local_40.numFlags.raw;
  matchingDelim.rawLen = local_40.rawLen;
  actual.info = pIVar3;
  TVar9 = Token::createExpected(alloc,diagnostics,actual,kind,TVar9,matchingDelim);
  return TVar9;
}

Assistant:

Token Preprocessor::MacroParser::expect(TokenKind kind) {
    if (currentIndex >= buffer.size())
        return pp.expect(kind);

    if (buffer[currentIndex].kind != kind) {
        Token last = currentIndex > 0 ? buffer[currentIndex - 1] : Token();
        return Token::createExpected(pp.alloc, pp.diagnostics, buffer[currentIndex], kind, last,
                                     Token());
    }
    return next();
}